

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-io.c
# Opt level: O0

_Bool clean_tempfile(char *dest,GError **error)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int e;
  int result;
  GError **error_local;
  char *dest_local;
  
  if (tmpfile_path == (char *)0x0) {
    dest_local._7_1_ = true;
  }
  else {
    if (prev_fh != (FILE *)0x0) {
      fclose((FILE *)out_fh);
      out_fh = prev_fh;
    }
    iVar2 = rename(tmpfile_path,dest);
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      uVar3 = g_file_error_quark();
      uVar4 = g_file_error_from_errno(iVar1);
      uVar6 = gettext("%s. Temp file \'%s\' can\'t be moved to destination.");
      uVar7 = g_strerror(iVar1);
      g_set_error(error,uVar3,uVar4,uVar6,uVar7,tmpfile_path);
    }
    g_free(tmpfile_path);
    dest_local._7_1_ = iVar2 == 0;
  }
  return dest_local._7_1_;
}

Assistant:

bool
clean_tempfile   (char      *dest,
                  GError   **error)
{
    int result;

    if (tmpfile_path == NULL)
        return true;

    if (prev_fh)
    {
        fclose (out_fh);
        out_fh = prev_fh;
    }

    if (0 != (result = g_rename (tmpfile_path, dest)))
    {
        int e = errno;
        g_set_error (error, G_FILE_ERROR, g_file_error_from_errno(e),
            _("%s. Temp file '%s' can't be moved to destination."),
            g_strerror(e), tmpfile_path);
    }
    g_free (tmpfile_path);

    return (result == 0);
}